

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Http_client_connection::handle_input(Http_client_connection *this,bool *param_1)

{
  Connection *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Reactor_base *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  Packet *pPVar5;
  network_error *this_00;
  pointer pcVar6;
  long lVar7;
  string local_50;
  
  pcVar6 = (this->super_Client_connection).read_buf_.super__Vector_base<char,_std::allocator<char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->super_Client_connection).read_buf_.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pcVar6;
  pCVar1 = &this->super_Connection;
  paVar2 = &local_50.field_2;
  do {
    if (this->resp_packet != (Packet *)0x0) break;
    iVar4 = (*(pCVar1->super_Event_handler)._vptr_Event_handler[0xd])(pCVar1,pcVar6,lVar7);
    lVar7 = CONCAT44(extraout_var,iVar4);
    if (lVar7 == 0) {
      this_00 = (network_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Connection closed by peer.","");
      iqnet::network_error::network_error(this_00,&local_50,false,0);
      __cxa_throw(this_00,&iqnet::network_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar6,pcVar6 + lVar7);
    pPVar5 = Client_connection::read_response(&this->super_Client_connection,&local_50,false);
    this->resp_packet = pPVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
  } while (lVar7 == (long)(this->super_Client_connection).read_buf_.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pcVar6);
  if (this->resp_packet != (Packet *)0x0) {
    pRVar3 = (this->reactor)._M_ptr;
    (*pRVar3->_vptr_Reactor_base[4])(pRVar3,pCVar1);
  }
  return;
}

Assistant:

void Http_client_connection::handle_input( bool& )
{
  for( size_t sz = read_buf_sz(); (sz == read_buf_sz()) && !resp_packet ; )
  {
    if( !(sz = recv( read_buf(), read_buf_sz() )) )
      throw iqnet::network_error( "Connection closed by peer.", false );

    resp_packet = read_response( std::string(read_buf(), sz) );
  }

  if( resp_packet )
    reactor->unregister_handler( this );
}